

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O1

void __thiscall r_code::View::View(View *this)

{
  long lVar1;
  
  lVar1 = 0;
  (this->super__Object).refCount.super___atomic_base<long>._M_i = 0;
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__View_0011cb90;
  (this->object).object = (_Object *)0x0;
  do {
    r_code::Atom::Atom((Atom *)((long)this->references + lVar1 + 0x18),0xffffffff);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x34);
  this->references[0] = (Code *)0x0;
  this->references[1] = (Code *)0x0;
  return;
}

Assistant:

View(): object(NULL)
    {
        references[0] = references[1] = NULL;
    }